

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O2

void __thiscall common::Options::ParseHosts(Options *this,string *s)

{
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  allocator local_89;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  string local_30;
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_30,"-",&local_89);
  xlib::Split(s,&local_30,&local_88);
  std::__cxx11::string::~string((string *)&local_30);
  lVar3 = (long)local_88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar3 == 1) {
    bVar1 = xlib::IsNumber(local_88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_70,
                 (string *)
                 local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      uVar2 = xlib::Stou(&local_70);
      this->index = uVar2;
      std::__cxx11::string::~string((string *)&local_70);
      this->run_type = RunType_index;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->group);
      this->run_type = RunType_group;
    }
  }
  else if (lVar3 == 2) {
    std::__cxx11::string::_M_assign((string *)&this->group);
    bVar1 = xlib::IsNumber(local_88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
    if (bVar1) {
      this->run_type = RunType_group_index;
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 (local_88.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      uVar2 = xlib::Stou(&local_50);
      this->index = uVar2;
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->tag);
      this->run_type = RunType_group_tag;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void Options::ParseHosts(const std::string& s) {
    std::vector<std::string> vec;
    xlib::Split(s, "-", &vec);
    if (vec.size() == 2) {
        group  = vec[0];
        if (xlib::IsNumber(vec[1])) {
            run_type = common::RunType_group_index;
            index = xlib::Stou(vec[1]);
        } else {
            tag = vec[1];
            run_type = common::RunType_group_tag;
        }
    } else if (vec.size() == 1) {
        if (xlib::IsNumber(vec[0])) {
            index = xlib::Stou(vec[0]);
            run_type = common::RunType_index;
        } else {
            group = vec[0];
            run_type = common::RunType_group;
        }
    }
}